

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLine.cpp
# Opt level: O1

bool __thiscall
chrono::geometry::ChLine::DrawPostscript
          (ChLine *this,ChFile_ps *mfle,int markpoints,int bezier_interpolate)

{
  int iVar1;
  int iVar2;
  double dVar3;
  ChVector<double> mv1;
  double local_a8;
  double dStack_a0;
  undefined8 local_98;
  ChVector2<double> local_90;
  ChVector2<double> local_80;
  ChVector2<double> local_70;
  ChVector2<double> local_60;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  local_98 = 0;
  ChFile_ps::GrSave(mfle);
  local_40.m_data[0] = (mfle->G_p).m_data[0];
  local_40.m_data[1] = (mfle->G_p).m_data[1];
  local_50.m_data[0] = (mfle->Gs_p).m_data[0];
  local_50.m_data[1] = (mfle->Gs_p).m_data[1];
  ChFile_ps::ClipRectangle(mfle,&local_40,&local_50,PAGE);
  ChFile_ps::StartLine(mfle);
  (*(this->super_ChGeometry)._vptr_ChGeometry[0xb])(0,this,&local_a8);
  local_60.m_data[0] = local_a8;
  local_60.m_data[1] = dStack_a0;
  ChFile_ps::To_page_from_graph(mfle,&local_60);
  ChFile_ps::MoveTo(mfle,&local_70);
  iVar1 = (*(this->super_ChGeometry)._vptr_ChGeometry[0xf])(this);
  if (0 < iVar1) {
    dVar3 = 1.0;
    iVar2 = 2;
    do {
      (*(this->super_ChGeometry)._vptr_ChGeometry[0xb])(dVar3 / (double)(iVar1 * 10),this,&local_a8)
      ;
      local_80.m_data[0] = local_a8;
      local_80.m_data[1] = dStack_a0;
      ChFile_ps::To_page_from_graph(mfle,&local_80);
      ChFile_ps::AddLinePoint(mfle,&local_90);
      dVar3 = (double)iVar2;
      iVar2 = iVar2 + 1;
    } while (dVar3 <= (double)(iVar1 * 10));
  }
  iVar1 = (*(this->super_ChGeometry)._vptr_ChGeometry[0xd])(this);
  if ((char)iVar1 != '\0') {
    ChFile_ps::CloseLine(mfle);
  }
  ChFile_ps::PaintStroke(mfle);
  ChFile_ps::GrRestore(mfle);
  return true;
}

Assistant:

bool ChLine::DrawPostscript(ChFile_ps* mfle, int markpoints, int bezier_interpolate) {
    ChVector2<> mp1;
    ChVector<> mv1;

    mfle->GrSave();
    mfle->ClipRectangle(mfle->Get_G_p(), mfle->Get_Gs_p(), ChFile_ps::Space::PAGE);
    // start a line, move cursor to beginning
    mfle->StartLine();
    this->Evaluate(mv1, 0.0);
    mp1.x() = mv1.x();
    mp1.y() = mv1.y();
    mp1 = mfle->To_page_from_graph(mp1);
    mfle->MoveTo(mp1);
    double maxpoints = this->Get_complexity() * 10;
    // add points into line
    for (int i = 1; i <= maxpoints; i++) {
        this->Evaluate(mv1, ((double)i) / ((double)maxpoints));
        mp1.x() = mv1.x();
        mp1.y() = mv1.y();
        mp1 = mfle->To_page_from_graph(mp1);
        mfle->AddLinePoint(mp1);
    }
    if (this->Get_closed())
        mfle->CloseLine();  // if periodic curve, close it

    mfle->PaintStroke();  // draw it!
    mfle->GrRestore();    // restore old modes, with old clipping

    return true;
}